

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.cpp
# Opt level: O2

void __thiscall
yactfr::internal::TraceTypeImpl::TraceTypeImpl
          (TraceTypeImpl *this,uint majorVersion,uint minorVersion,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ns,optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *name,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *uid,TraceEnvironment *env,Up *pktHeaderType,ClockTypeSet *clkTypes,
          DataStreamTypeSet *dsts,Up *attrs,TraceType *traceType)

{
  this->_majorVersion = majorVersion;
  this->_minorVersion = minorVersion;
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional_base(&(this->_ns).super_type,&ns->super_type);
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional_base(&(this->_name).super_type,&name->super_type);
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional_base(&(this->_uid).super_type,&uid->super_type);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->_env)._entries._M_t._M_impl.super__Rb_tree_header,
             &(env->_entries)._M_t._M_impl.super__Rb_tree_header);
  (this->_pktHeaderType)._M_t.
  super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
  .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl =
       (pktHeaderType->_M_t).
       super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
       .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl;
  (pktHeaderType->_M_t).
  super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
  .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl = (StructureType *)0x0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->_clkTypes)._M_t._M_impl.super__Rb_tree_header,
             &(clkTypes->_M_t)._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->_dsts)._M_t._M_impl.super__Rb_tree_header,
             &(dsts->_M_t)._M_impl.super__Rb_tree_header);
  (this->_idsToDsts)._M_h._M_buckets = &(this->_idsToDsts)._M_h._M_single_bucket;
  (this->_idsToDsts)._M_h._M_bucket_count = 1;
  (this->_idsToDsts)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_idsToDsts)._M_h._M_element_count = 0;
  (this->_idsToDsts)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_idsToDsts)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_idsToDsts)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_attrs)._M_t.
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (attrs->_M_t).
       super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  (attrs->_M_t).
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl = (MapItem *)0x0;
  this->_traceType = traceType;
  (this->_pktProc)._M_t.
  super___uniq_ptr_impl<const_yactfr::internal::PktProc,_std::default_delete<const_yactfr::internal::PktProc>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_yactfr::internal::PktProc_*,_std::default_delete<const_yactfr::internal::PktProc>_>
  .super__Head_base<0UL,_const_yactfr::internal::PktProc_*,_false>._M_head_impl = (PktProc *)0x0;
  _buildDstMap(this);
  _createParentLinks(this,traceType);
  _setDispNames(this);
  _setKeyDts(this);
  return;
}

Assistant:

TraceTypeImpl::TraceTypeImpl(const unsigned int majorVersion, const unsigned int minorVersion,
                             boost::optional<std::string>&& ns,
                             boost::optional<std::string>&& name,
                             boost::optional<std::string>&& uid, TraceEnvironment&& env,
                             StructureType::Up pktHeaderType, ClockTypeSet&& clkTypes,
                             DataStreamTypeSet&& dsts, MapItem::Up attrs,
                             const TraceType& traceType) :
    _majorVersion {majorVersion},
    _minorVersion {minorVersion},
    _ns {std::move(ns)},
    _name {std::move(name)},
    _uid {std::move(uid)},
    _env {std::move(env)},
    _pktHeaderType {std::move(pktHeaderType)},
    _clkTypes {std::move(clkTypes)},
    _dsts {std::move(dsts)},
    _attrs {std::move(attrs)},
    _traceType {&traceType}
{
    this->_buildDstMap();
    this->_createParentLinks(traceType);
    this->_setDispNames();
    this->_setKeyDts();
}